

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

Result __thiscall
presolve::HPresolve::liftingForProbing(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  _Rb_tree_node_base *__args;
  double dVar1;
  HighsMipSolverData *pHVar2;
  pointer ppVar3;
  HighsLp *pHVar4;
  pointer pdVar5;
  Result RVar6;
  mapped_type *pmVar7;
  ulong uVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  char cVar11;
  int iVar12;
  double dVar13;
  Result RVar14;
  _Base_ptr p_Var15;
  Result unaff_EBP;
  const_iterator __begin2;
  pointer ppVar16;
  size_type __n;
  HighsPostsolveStack *__x;
  tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
  *ptVar17;
  _Link_type p_Var18;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *clique;
  HighsDomain *pHVar19;
  pointer ptVar20;
  CliqueVar *cliquevar;
  long lVar21;
  long lVar22;
  uint uVar23;
  const_iterator __end2;
  undefined1 *puVar24;
  double dVar25;
  bool isredundant;
  bool dense;
  bool fillallowed;
  HighsInt row;
  HighsInt bestnfill;
  double bestscore;
  double bestscoretotal;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> candidates;
  map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
  coefficients;
  vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
  cliques;
  anon_class_8_1_0b815314 computeOverallScore;
  vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
  liftingtable;
  bool local_177;
  bool local_176;
  bool local_175;
  undefined1 local_174 [92];
  void *local_118;
  iterator iStack_110;
  CliqueVar *local_108;
  map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
  local_100;
  vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
  local_d0;
  anon_class_64_8_9ac467b2 local_b8;
  vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
  local_78;
  double local_58;
  undefined8 uStack_50;
  HighsCliqueTable *local_48;
  HighsDomain *local_40;
  HighsPostsolveStack *local_38;
  
  pHVar2 = (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  local_78.
  super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        *)0x0;
  local_78.
  super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        *)0x0;
  local_78.
  super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = (this->liftingOpportunities)._M_h._M_element_count;
  std::
  vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
  ::reserve(&local_78,__n);
  local_174._84_8_ = &DAT_fff0000000000000;
  local_175 = 0 < (this->mipsolver->options_mip_->super_HighsOptionsStruct).mip_lifting_for_probing;
  local_100._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_100._M_t._M_impl.super__Rb_tree_header._M_header;
  local_100._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lVar21 = 0;
  local_100._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_100._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ptVar17 = (tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             *)(this->liftingOpportunities)._M_h._M_before_begin._M_nxt;
  p_Var18 = (_Link_type)
            CONCAT71((int7)(__n >> 8),
                     ptVar17 ==
                     (tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      *)0x0);
  local_100._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_100._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (ptVar17 !=
      (tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
       *)0x0) {
    local_48 = &pHVar2->cliquetable;
    pHVar19 = &pHVar2->domain;
    lVar21 = 0;
    local_40 = pHVar19;
    local_38 = postsolve_stack;
    do {
      local_174._0_4_ =
           *(undefined4 *)
            &(ptVar17->
             super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             ).
             super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>._M_head_impl;
      cVar11 = '\x03';
      if ((this->rowDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start[(int)local_174._0_4_] == '\0') {
        local_174[0x34] = (char)p_Var18;
        iVar12 = (this->model->num_col_ - this->numDeletedCols) / 0x14;
        if (iVar12 < 0x3e9) {
          iVar12 = 1000;
        }
        local_176 = iVar12 < (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[(int)local_174._0_4_];
        local_b8.htree =
             (HighsHashTree<std::pair<int,_int>,_double> *)
             &(ptVar17->
              super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              ).
              super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .
              super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
        ;
        local_177 = false;
        local_b8.row = (HighsInt *)local_174;
        local_b8.isredundant = &local_177;
        local_b8.dense = &local_176;
        local_b8.fillallowed = &local_175;
        local_174._28_8_ = ptVar17;
        local_b8.this = this;
        local_b8.domain = pHVar19;
        local_b8.coefficients = &local_100;
        HighsHashTree<std::pair<int,_int>,_double>::
        for_each_recurse<void,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:1739:20)_&,_0>
                  ((NodePtr)(ptVar17->
                            super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                            ).
                            super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                            .
                            super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                            ._M_head_impl.
                            super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,&local_b8);
        if (local_177 == true) {
          HighsPostsolveStack::redundantRow(postsolve_stack,local_174._0_4_);
          p_Var18 = (_Link_type)(ulong)(uint)local_174._0_4_;
          removeRow(this,local_174._0_4_);
          std::
          _Rb_tree<HighsCliqueTable::CliqueVar,_std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>,_std::_Select1st<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
          ::_M_erase((_Rb_tree<HighsCliqueTable::CliqueVar,_std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>,_std::_Select1st<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                      *)local_100._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,p_Var18);
          local_100._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_100._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_100._M_t._M_impl.super__Rb_tree_header._M_header;
          local_100._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          __x = postsolve_stack;
          local_100._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_100._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          RVar6 = checkLimits(this,postsolve_stack);
          lVar21 = lVar21 + 1;
          cVar11 = (RVar6 == kOk) * '\x02' + '\x01';
          RVar14 = local_174._44_4_;
          if (RVar6 != kOk) {
            RVar14 = RVar6;
          }
          local_174._44_4_ = RVar14;
        }
        else if (local_100._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
          cVar11 = '\x03';
          __x = (HighsPostsolveStack *)0x0;
        }
        else {
          local_b8.this = (HPresolve *)0x0;
          local_b8.row = (HighsInt *)0x0;
          local_b8.isredundant = (bool *)0x0;
          local_174._36_8_ = &DAT_fff0000000000000;
          local_174._24_4_ = 0;
          local_108 = (CliqueVar *)0x0;
          local_118 = (void *)0x0;
          iStack_110._M_current = (CliqueVar *)0x0;
          local_174._76_8_ = lVar21;
          std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
          reserve((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   *)&local_118,local_100._M_t._M_impl.super__Rb_tree_header._M_node_count);
          for (p_Var15 = local_100._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var15 != &local_100._M_t._M_impl.super__Rb_tree_header;
              p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15)) {
            __args = p_Var15 + 1;
            if (iStack_110._M_current == local_108) {
              std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
              _M_realloc_insert<HighsCliqueTable::CliqueVar_const&>
                        ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                          *)&local_118,iStack_110,(CliqueVar *)__args);
            }
            else {
              *iStack_110._M_current = (CliqueVar)__args->_M_color;
              iStack_110._M_current = iStack_110._M_current + 1;
            }
            iVar12 = *(int *)&p_Var15[1]._M_left;
            if ((long)iVar12 == -1) {
              dVar13 = 0.0;
            }
            else {
              dVar13 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar12];
            }
            puVar24 = (undefined1 *)ABS((double)p_Var15[1]._M_parent - dVar13);
            if ((double)local_174._36_8_ < (double)puVar24) {
              local_174._24_4_ = ZEXT14(iVar12 == -1);
              local_d0.
              super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = __args->_M_color;
              local_174._36_8_ = puVar24;
              local_d0.
              super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var15[1]._M_parent;
              std::
              vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>
              ::_M_assign_aux<std::pair<HighsCliqueTable::CliqueVar,double>const*>
                        ((vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>
                          *)&local_b8,&local_d0,
                         &local_d0.
                          super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
          }
          if (4 < (ulong)((long)iStack_110._M_current - (long)local_118)) {
            HighsCliqueTable::computeMaximalCliques
                      (&local_d0,local_48,
                       (vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        *)&local_118,this->primal_feastol);
            p_Var15 = (_Base_ptr)
                      CONCAT44(local_d0.
                               super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                               (_Rb_tree_color)
                               local_d0.
                               super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
            local_174._60_8_ =
                 local_d0.
                 super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (p_Var15 !=
                (_Base_ptr)
                local_d0.
                super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              do {
                p_Var9 = *(_Base_ptr *)p_Var15;
                p_Var10 = p_Var15->_M_parent;
                puVar24 = (undefined1 *)0x0;
                if (p_Var9 == p_Var10) {
                  uVar23 = 0;
                }
                else {
                  local_174._4_8_ = 0.0;
                  uVar23 = 0;
                  local_174._12_8_ = 0.0;
                  do {
                    pmVar7 = std::
                             map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                             ::operator[](&local_100,(key_type *)p_Var9);
                    local_58 = pmVar7->first;
                    uStack_50 = 0;
                    pmVar7 = std::
                             map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                             ::operator[](&local_100,(key_type *)p_Var9);
                    if ((long)pmVar7->second == -1) {
                      local_174._68_8_ = 0.0;
                    }
                    else {
                      local_174._68_8_ =
                           (this->Avalue).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[pmVar7->second];
                    }
                    pmVar7 = std::
                             map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                             ::operator[](&local_100,(key_type *)p_Var9);
                    dVar25 = ABS(local_58 - (double)local_174._68_8_);
                    dVar13 = (double)local_174._12_8_ + dVar25;
                    local_174._4_8_ =
                         (double)local_174._4_8_ +
                         ((dVar13 - dVar25) - dVar13) + dVar25 +
                         ((double)local_174._12_8_ - (dVar13 - dVar25));
                    uVar23 = uVar23 + (pmVar7->second == -1);
                    p_Var9 = (_Base_ptr)&p_Var9->field_0x4;
                    local_174._12_8_ = dVar13;
                  } while (p_Var9 != p_Var10);
                  puVar24 = (undefined1 *)(dVar13 + (double)local_174._4_8_);
                }
                if ((double)local_174._36_8_ < (double)puVar24) {
                  if ((HPresolve *)local_b8.row != local_b8.this) {
                    local_b8.row = (HighsInt *)local_b8.this;
                  }
                  local_174._24_4_ = uVar23;
                  local_174._36_8_ = puVar24;
                  std::
                  vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                  ::reserve((vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                             *)&local_b8,(long)p_Var15->_M_parent - *(long *)p_Var15 >> 2);
                  p_Var10 = p_Var15->_M_parent;
                  for (p_Var9 = *(_Base_ptr *)p_Var15; p_Var9 != p_Var10;
                      p_Var9 = (_Base_ptr)&p_Var9->field_0x4) {
                    pmVar7 = std::
                             map<HighsCliqueTable::CliqueVar,_std::pair<double,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                             ::operator[](&local_100,(key_type *)p_Var9);
                    std::
                    vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>
                    ::emplace_back<HighsCliqueTable::CliqueVar_const&,double&>
                              ((vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>
                                *)&local_b8,(CliqueVar *)p_Var9,&pmVar7->first);
                  }
                }
                p_Var15 = (_Base_ptr)&p_Var15->_M_right;
              } while (p_Var15 != (_Base_ptr)local_174._60_8_);
            }
            std::
            vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
            ::~vector(&local_d0);
          }
          __x = (HighsPostsolveStack *)local_174;
          std::
          vector<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>,std::allocator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>>>
          ::
          emplace_back<int&,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>&,double&,int&>
                    ((vector<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>,std::allocator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>>>
                      *)&local_78,(int *)__x,
                     (vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                      *)&local_b8,(double *)(local_174 + 0x24),(int *)(local_174 + 0x18));
          puVar24 = (undefined1 *)local_174._36_8_;
          if ((double)local_174._36_8_ <= (double)local_174._84_8_) {
            puVar24 = (undefined1 *)local_174._84_8_;
          }
          local_174._84_8_ = puVar24;
          std::
          _Rb_tree<HighsCliqueTable::CliqueVar,_std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>,_std::_Select1st<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
          ::_M_erase((_Rb_tree<HighsCliqueTable::CliqueVar,_std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>,_std::_Select1st<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
                      *)local_100._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                     (_Link_type)__x);
          postsolve_stack = local_38;
          pHVar19 = local_40;
          lVar21 = local_174._76_8_;
          local_100._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_100._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_100._M_t._M_impl.super__Rb_tree_header._M_header;
          local_100._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_100._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_100._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          if (local_118 != (void *)0x0) {
            operator_delete(local_118);
          }
          if (local_b8.this != (HPresolve *)0x0) {
            operator_delete(local_b8.this);
          }
          cVar11 = '\0';
        }
        p_Var18 = (_Link_type)CONCAT71((int7)((ulong)__x >> 8),local_174[0x34]);
        ptVar17 = (tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                   *)local_174._28_8_;
      }
      if ((cVar11 != '\x03') && (cVar11 != '\0')) break;
      ptVar17 = *(tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                  **)&(ptVar17->
                      super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      ).
                      super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      .super__Tuple_impl<2UL,_double,_int>;
      p_Var18 = (_Link_type)
                CONCAT71((int7)((ulong)p_Var18 >> 8),
                         ptVar17 ==
                         (tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                          *)0x0);
    } while (ptVar17 !=
             (tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              *)0x0);
    unaff_EBP = (Result)local_174._44_8_;
  }
  if (((ulong)p_Var18 & 1) != 0) {
    local_b8.this = (HPresolve *)(local_174 + 0x54);
    local_174._76_8_ = lVar21;
    if (local_78.
        super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_78.
        super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar8 = ((long)local_78.
                     super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_78.
                     super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
      iVar12 = 0;
      if (1 < uVar8) {
        iVar12 = 0;
        do {
          uVar8 = (long)uVar8 >> 1;
          iVar12 = iVar12 + 1;
        } while (1 < uVar8);
      }
      pdqsort_detail::
      pdqsort_loop<__gnu_cxx::__normal_iterator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>*,std::vector<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>,std::allocator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>>>>,presolve::HPresolve::liftingForProbing(presolve::HighsPostsolveStack&)::__4,false>
                ((__normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
                  )local_78.
                   super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
                  )local_78.
                   super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(anon_class_8_1_0b815314 *)&local_b8,
                 iVar12,true);
    }
    p_Var9 = (_Base_ptr)
             (((long)local_78.
                     super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_78.
                     super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555552);
    p_Var15 = (_Base_ptr)
              ((ulong)(long)((int)((ulong)((long)(this->Avalue).
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(this->Avalue).
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_start) >> 3) -
                            (int)((ulong)((long)(this->freeslots).
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->freeslots).
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start) >> 2)) / 100);
    if (p_Var15 <= p_Var9 && (long)p_Var9 - (long)p_Var15 != 0) {
      p_Var15 = p_Var9;
    }
    if (local_78.
        super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_78.
        super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      dVar25 = 0.0;
      dVar13 = 0.0;
      p_Var9 = (_Base_ptr)0x0;
    }
    else {
      p_Var9 = (_Base_ptr)0x0;
      dVar13 = 0.0;
      dVar25 = 0.0;
      local_174._28_8_ =
           local_78.
           super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      ptVar17 = local_78.
                super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ptVar20 = local_78.
                super__Vector_base<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_174._44_8_ = p_Var15;
      do {
        lVar21 = (long)(ptVar20->
                       super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                       ).
                       super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                       .super__Tuple_impl<2UL,_double,_int>.super__Tuple_impl<3UL,_int>.
                       super__Head_base<3UL,_int,_false>._M_head_impl;
        p_Var10 = (_Base_ptr)((long)&p_Var9->_M_color + lVar21);
        if (p_Var10 <= p_Var15) {
          iVar12 = (ptVar20->
                   super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                   ).super__Head_base<0UL,_int,_false>._M_head_impl;
          ppVar16 = (ptVar20->
                    super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    ).
                    super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    .
                    super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                    ._M_head_impl.
                    super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppVar3 = *(pointer *)
                    ((long)&(ptVar20->
                            super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                            ).
                            super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                            .
                            super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                            ._M_head_impl.
                            super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                            ._M_impl.super__Vector_impl_data + 8);
          lVar22 = (long)ppVar3 - (long)ppVar16;
          local_174._52_8_ = lVar21;
          local_174._60_8_ = p_Var10;
          local_174._68_8_ = dVar13;
          local_58 = dVar25;
          if (lVar22 == 0) {
            local_174._4_8_ = 0.0;
            local_174._12_8_ = 0.0;
          }
          else {
            local_174._12_8_ = 0.0;
            local_174._4_8_ = 0.0;
            do {
              addToMatrix(this,iVar12,(uint)ppVar16->first & 0x7fffffff,ppVar16->second);
              if (-1 < (int)ppVar16->first) {
                dVar13 = ppVar16->second;
                dVar25 = (double)local_174._12_8_ + dVar13;
                local_174._4_8_ =
                     (double)local_174._4_8_ +
                     ((double)local_174._12_8_ - (dVar25 - dVar13)) +
                     (dVar13 - (dVar25 - (dVar25 - dVar13)));
                local_174._12_8_ = dVar25;
              }
              ppVar16 = ppVar16 + 1;
            } while (ppVar16 != ppVar3);
          }
          pHVar4 = this->model;
          pdVar5 = (pHVar4->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar13 = pdVar5[iVar12];
          if (-INFINITY < dVar13) {
            pdVar5[iVar12] = dVar13 + (double)local_174._4_8_ + (double)local_174._12_8_;
          }
          dVar13 = (double)(local_174._68_8_ + ((lVar22 >> 4) - local_174._52_8_));
          dVar25 = (double)((long)local_58 + 1);
          pdVar5 = (pHVar4->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar1 = pdVar5[iVar12];
          p_Var10 = (_Base_ptr)local_174._60_8_;
          p_Var15 = (_Base_ptr)local_174._44_8_;
          ptVar17 = (tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                     *)local_174._28_8_;
          p_Var9 = (_Base_ptr)local_174._60_8_;
          if (dVar1 < INFINITY) {
            pdVar5[iVar12] = (double)local_174._4_8_ + (double)local_174._12_8_ + dVar1;
          }
        }
      } while ((p_Var10 <= p_Var15) && (ptVar20 = ptVar20 + 1, ptVar20 != ptVar17));
    }
    unaff_EBP = kOk;
    p_Var18 = (_Link_type)&DAT_00000001;
    highsLogDev(&(this->options->super_HighsOptionsStruct).log_options,kInfo,
                "Lifting for probing removed %d and modified %d row(s), added %d new and modified %d existing nonzero(s)\n"
                ,local_174._76_8_,dVar25,p_Var9,SUB84(dVar13,0));
  }
  std::
  _Rb_tree<HighsCliqueTable::CliqueVar,_std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>,_std::_Select1st<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/presolve/HPresolve.cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
  ::_M_erase((_Rb_tree<HighsCliqueTable::CliqueVar,_std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>,_std::_Select1st<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:1716:15),_std::allocator<std::pair<const_HighsCliqueTable::CliqueVar,_std::pair<double,_int>_>_>_>
              *)local_100._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,p_Var18);
  std::
  vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>
  ::~vector(&local_78);
  return unaff_EBP;
}

Assistant:

HPresolve::Result HPresolve::liftingForProbing(
    HighsPostsolveStack& postsolve_stack) {
  // this method implements lifting for probing as described by Achterberg et
  // al. (2019) Presolve Reductions in Mixed Integer Programming. INFORMS
  // Journal on Computing 32(2):473-506.
  HighsCliqueTable& cliquetable = mipsolver->mipdata_->cliquetable;
  const HighsDomain& domain = mipsolver->mipdata_->domain;

  // collect best lifting opportunity for each row in a vector
  typedef std::pair<HighsCliqueTable::CliqueVar, double> liftingvar;
  typedef std::tuple<HighsInt, std::vector<liftingvar>, double, HighsInt>
      liftingdata;
  std::vector<liftingdata> liftingtable;
  liftingtable.reserve(liftingOpportunities.size());

  // remember overall best score
  double bestscoretotal = -kHighsInf;

  // is lifting allowed to add non-zeros?
  const bool fillallowed = mipsolver->options_mip_->mip_lifting_for_probing > 0;

  // store clique variables and coefficients in a map
  auto comp = [](const HighsCliqueTable::CliqueVar& c1,
                 const HighsCliqueTable::CliqueVar& c2) {
    return c1.col < c2.col || (c1.col == c2.col && c1.val < c2.val);
  };
  std::map<HighsCliqueTable::CliqueVar, std::pair<double, HighsInt>,
           decltype(comp)>
      coefficients(comp);

  // consider lifting opportunities
  size_t numrowsremoved = 0;
  for (const auto& elm : liftingOpportunities) {
    // get row index and skip deleted rows
    HighsInt row = elm.first;
    if (rowDeleted[row]) continue;

    // do not add non-zeros to dense rows
    const bool dense =
        rowsize[row] >
        std::max(HighsInt{1000}, (model->num_col_ - numDeletedCols) / 20);

    // iterate over elements in hash tree
    const auto& htree = elm.second;
    bool isredundant = false;
    htree.for_each([&](const std::pair<HighsInt, HighsInt>& data, double coef) {
      HighsInt col = data.first;
      HighsInt val = data.second;
      HighsInt pos = findNonzero(row, col);
      isredundant = isredundant || htree.contains(std::make_pair(col, 1 - val));
      if (!dense && (fillallowed || pos != -1) && !colDeleted[col] &&
          !domain.isFixed(col))
        coefficients[HighsCliqueTable::CliqueVar{col, val}] = {coef, pos};
    });

    // remove redundant rows
    if (isredundant) {
      numrowsremoved++;
      postsolve_stack.redundantRow(row);
      removeRow(row);
      coefficients.clear();
      HPRESOLVE_CHECKED_CALL(checkLimits(postsolve_stack));
      continue;
    }

    // skip rows with empty coefficient map
    if (coefficients.empty()) continue;

    // vector to hold best clique
    std::vector<liftingvar> bestclique;
    double bestscore = -kHighsInf;
    HighsInt bestnfill = 0;

    // lambda for computing coefficient difference
    auto computeCoeffDiff = [&](double newvalue, HighsInt nzpos) {
      return std::fabs(newvalue - (nzpos == -1 ? 0 : Avalue[nzpos]));
    };

    // store candidates in a vector
    std::vector<HighsCliqueTable::CliqueVar> candidates;
    candidates.reserve(coefficients.size());
    for (const auto& elm : coefficients) {
      candidates.push_back(elm.first);
      // initialize best clique
      double score = computeCoeffDiff(elm.second.first, elm.second.second);
      if (score > bestscore) {
        bestscore = score;
        bestnfill = elm.second.second == -1 ? 1 : 0;
        bestclique = {std::make_pair(elm.first, elm.second.first)};
      }
    }

    if (candidates.size() > 1) {
      // compute cliques
      auto cliques =
          cliquetable.computeMaximalCliques(candidates, primal_feastol);

      // identify clique with highest score
      for (const auto& clique : cliques) {
        HighsCDouble score = 0;
        HighsInt nfill = 0;
        for (const auto& cliquevar : clique) {
          score += computeCoeffDiff(coefficients[cliquevar].first,
                                    coefficients[cliquevar].second);
          if (coefficients[cliquevar].second == -1) nfill++;
        }
        if (score > bestscore) {
          bestscore = static_cast<double>(score);
          bestnfill = nfill;
          bestclique.clear();
          bestclique.reserve(clique.size());
          for (const auto& cliquevar : clique) {
            bestclique.emplace_back(cliquevar, coefficients[cliquevar].first);
          }
        }
      }
    }

    // store best clique
    liftingtable.emplace_back(row, bestclique, bestscore, bestnfill);
    bestscoretotal = std::max(bestscoretotal, bestscore);
    coefficients.clear();
  }

  // lambda for computing score
  auto computeOverallScore = [&](double score, HighsInt numelms,
                                 HighsInt numfillin) {
    const double weight = 0.5;
    return weight * (score / bestscoretotal) +
           (1 - weight) * static_cast<double>(numelms - numfillin) /
               static_cast<double>(numelms);
  };

  // sort according to score
  pdqsort(
      liftingtable.begin(), liftingtable.end(),
      [&](const liftingdata& opp1, const liftingdata& opp2) {
        double score1 = computeOverallScore(
            std::get<2>(opp1), static_cast<HighsInt>(std::get<1>(opp1).size()),
            std::get<3>(opp1));
        double score2 = computeOverallScore(
            std::get<2>(opp2), static_cast<HighsInt>(std::get<1>(opp2).size()),
            std::get<3>(opp2));
        return (score1 == score2 ? std::get<0>(opp1) < std::get<0>(opp2)
                                 : score1 > score2);
      });

  // perform actual lifting
  size_t nfill = 0;
  size_t nmod = 0;
  size_t numrowsmodified = 0;
  const size_t maxnfill = std::max(10 * liftingtable.size(),
                                   static_cast<size_t>(numNonzeros()) / 100);
  for (const auto& lifting : liftingtable) {
    // get clique
    HighsInt row = std::get<0>(lifting);
    const auto& bestclique = std::get<1>(lifting);

    // check against max. fill-in
    size_t newfill = static_cast<size_t>(std::get<3>(lifting));
    if (nfill + newfill > maxnfill) break;
    nfill += newfill;
    nmod += bestclique.size() - newfill;

    // update matrix
    HighsCDouble update = 0.0;
    for (const auto& elm : bestclique) {
      // get data
      const auto& cliquevar = std::get<0>(elm);
      const double& coeff = std::get<1>(elm);
      // add non-zero to matrix
      addToMatrix(row, cliquevar.col, coeff);
      // compute term to update left-hand / right-hand side
      if (cliquevar.val == 0) update += coeff;
    }

    // update left-hand / right-hand sides
    numrowsmodified++;
    if (model->row_lower_[row] != -kHighsInf)
      model->row_lower_[row] += static_cast<double>(update);
    if (model->row_upper_[row] != kHighsInf)
      model->row_upper_[row] += static_cast<double>(update);
  }

  highsLogDev(options->log_options, HighsLogType::kInfo,
              "Lifting for probing removed %d and modified %d row(s), added %d "
              "new and modified %d existing nonzero(s)\n",
              static_cast<int>(numrowsremoved),
              static_cast<int>(numrowsmodified), static_cast<int>(nfill),
              static_cast<int>(nmod));

  return Result::kOk;
}